

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleTypeHandler<2UL>::SimpleTypeHandler
          (SimpleTypeHandler<2UL> *this,long SharedFunctionPropertyDescriptors,byte param_3,
          uint16 param_4,uint16 param_5)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  undefined4 *puVar5;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,2,param_4,param_5,'\x1d');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01557190
  ;
  this->propertyCount = 2;
  lVar4 = 0x20;
  do {
    puVar1 = (undefined8 *)
             ((long)&(((SimpleTypeHandler<2UL> *)(this->descriptors + -2))->super_DynamicTypeHandler
                     )._vptr_DynamicTypeHandler + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)((long)this->descriptors + lVar4 + -0x18) = 7;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar4 = 0;
  do {
    if ((*(byte *)(SharedFunctionPropertyDescriptors + 8 + lVar4) & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x42,
                                  "((SharedFunctionPropertyDescriptors[i].Attributes & 0x08) == 0)",
                                  "(SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0"
                                 );
      if (!bVar3) goto LAB_00e590b1;
      *puVar5 = 0;
    }
    *(undefined8 *)((long)&this->descriptors[0].Id.ptr + lVar4) =
         *(undefined8 *)(SharedFunctionPropertyDescriptors + lVar4);
    *(undefined1 *)((long)&this->descriptors[0].field_1 + lVar4) =
         *(undefined1 *)(SharedFunctionPropertyDescriptors + 8 + lVar4);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 == 0x10);
  if ((param_3 & 0x60) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x47,
                                "((propertyTypes & ((0x80|0x10|0x20|0x40) & ~(0x10 | 0x80))) == 0)",
                                "(propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0"
                               );
    if (!bVar3) {
LAB_00e590b1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  DynamicTypeHandler::SetPropertyTypes(&this->super_DynamicTypeHandler,0x90,param_3);
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(NO_WRITE_BARRIER_TAG_TYPE(SimplePropertyDescriptor const (&SharedFunctionPropertyDescriptors)[size]), PropertyTypes propertyTypes, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots) :
         DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
         inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag), propertyCount(size)
    {
        for (size_t i = 0; i < size; i++)
        {
            Assert((SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0);
             // Used to init from global static BuiltInPropertyId
            NoWriteBarrierSet(descriptors[i].Id, SharedFunctionPropertyDescriptors[i].Id);
            descriptors[i].Attributes = SharedFunctionPropertyDescriptors[i].Attributes;
        }
        Assert((propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0);
        SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties, propertyTypes);
        SetIsInlineSlotCapacityLocked();
    }